

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLisp.cpp
# Opt level: O0

void __thiscall DL::DataLisp_Internal::~DataLisp_Internal(DataLisp_Internal *this)

{
  SyntaxTree *pSVar1;
  bool bVar2;
  reference ppSVar3;
  StatementNode *ptr;
  iterator __end3;
  iterator __begin3;
  vector_t<StatementNode_*> *__range3;
  DataLisp_Internal *this_local;
  
  if (this->mTree != (SyntaxTree *)0x0) {
    pSVar1 = this->mTree;
    __end3 = std::vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>::begin
                       (&pSVar1->Nodes);
    ptr = (StatementNode *)
          std::vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>::end
                    (&pSVar1->Nodes);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<DL::StatementNode_**,_std::vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>_>
                                       *)&ptr), bVar2) {
      ppSVar3 = __gnu_cxx::
                __normal_iterator<DL::StatementNode_**,_std::vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>_>
                ::operator*(&__end3);
      deleteNode(*ppSVar3);
      __gnu_cxx::
      __normal_iterator<DL::StatementNode_**,_std::vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>_>
      ::operator++(&__end3);
    }
    pSVar1 = this->mTree;
    if (pSVar1 != (SyntaxTree *)0x0) {
      SyntaxTree::~SyntaxTree(pSVar1);
      operator_delete(pSVar1,0x18);
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&)>_>_>
  ::~map(&this->mExpressions);
  return;
}

Assistant:

~DataLisp_Internal()
	{
		if (mTree) {
			for (StatementNode* ptr : mTree->Nodes)
				deleteNode(ptr);

			delete mTree;
		}
	}